

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# checkqueue.h
# Opt level: O1

void __thiscall CCheckQueue<FrozenCleanupCheck>::~CCheckQueue(CCheckQueue<FrozenCleanupCheck> *this)

{
  long lVar1;
  thread *t;
  long lVar2;
  long in_FS_OFFSET;
  UniqueLock<AnnotatedMixin<std::mutex>_> criticalblock1;
  unique_lock<std::mutex> local_38;
  long local_28;
  
  local_28 = *(long *)(in_FS_OFFSET + 0x28);
  local_38._M_owns = false;
  local_38._M_device = (mutex_type *)this;
  std::unique_lock<std::mutex>::lock(&local_38);
  this[0xd0] = (CCheckQueue<FrozenCleanupCheck>)0x1;
  std::unique_lock<std::mutex>::~unique_lock(&local_38);
  std::condition_variable::notify_all();
  lVar1 = *(long *)(this + 0xc0);
  for (lVar2 = *(long *)(this + 0xb8); lVar2 != lVar1; lVar2 = lVar2 + 8) {
    std::thread::join();
  }
  std::vector<std::thread,_std::allocator<std::thread>_>::~vector
            ((vector<std::thread,_std::allocator<std::thread>_> *)(this + 0xb8));
  std::vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_>::~vector
            ((vector<FrozenCleanupCheck,_std::allocator<FrozenCleanupCheck>_> *)(this + 0x88));
  std::condition_variable::~condition_variable((condition_variable *)(this + 0x58));
  std::condition_variable::~condition_variable((condition_variable *)(this + 0x28));
  if (*(long *)(in_FS_OFFSET + 0x28) == local_28) {
    return;
  }
  __stack_chk_fail();
}

Assistant:

~CCheckQueue()
    {
        WITH_LOCK(m_mutex, m_request_stop = true);
        m_worker_cv.notify_all();
        for (std::thread& t : m_worker_threads) {
            t.join();
        }
    }